

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O3

void cuddGetBranches(DdNode *g,DdNode **g1,DdNode **g0)

{
  *g1 = *(DdNode **)(((ulong)g & 0xfffffffffffffffe) + 0x10);
  *g0 = *(DdNode **)(((ulong)g & 0xfffffffffffffffe) + 0x18);
  if (((ulong)g & 1) != 0) {
    *(byte *)g1 = *(byte *)g1 ^ 1;
    *(byte *)g0 = *(byte *)g0 ^ 1;
  }
  return;
}

Assistant:

void
cuddGetBranches(
  DdNode * g,
  DdNode ** g1,
  DdNode ** g0)
{
    DdNode      *G = Cudd_Regular(g);

    *g1 = cuddT(G);
    *g0 = cuddE(G);
    if (Cudd_IsComplement(g)) {
        *g1 = Cudd_Not(*g1);
        *g0 = Cudd_Not(*g0);
    }

}